

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTcPrsNode * __thiscall
CTPNInlineObjectBase::adjust_for_dyn(CTPNInlineObjectBase *this,tcpn_dyncomp_info *info)

{
  CTPNObjProp *pCVar1;
  
  for (pCVar1 = (this->super_CTPNObjDef).proplist_.first_; pCVar1 != (CTPNObjProp *)0x0;
      pCVar1 = (pCVar1->super_CTPNObjPropBase).nxt_) {
    (*(pCVar1->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.
      super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x11])(pCVar1,info);
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNInlineObjectBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* adjust each property expression */
    for (CTPNObjProp *prop = proplist_.first_ ; prop != 0 ;
         prop = prop->get_next_prop())
        prop->adjust_for_dyn(info);

    /* we did our updates in-place */
    return this;
}